

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O2

void lj_cdata_free(global_State *g,GCcdata *cd)

{
  byte bVar1;
  ushort uVar2;
  long lVar3;
  GCcdata *pGVar4;
  long lVar5;
  GCcdata *pGVar6;
  size_t sVar7;
  
  bVar1 = cd->marked;
  if ((bVar1 & 0x10) != 0) {
    cd->marked = (g->gc).currentwhite & 3 | bVar1 & 0xf0 | 8;
    pGVar4 = (GCcdata *)(g->gc).mmudata.gcptr64;
    pGVar6 = cd;
    if (pGVar4 != (GCcdata *)0x0) {
      (cd->nextgc).gcptr64 = (pGVar4->nextgc).gcptr64;
      pGVar6 = pGVar4;
    }
    (pGVar6->nextgc).gcptr64 = (uint64_t)cd;
    (g->gc).mmudata.gcptr64 = (uint64_t)cd;
    return;
  }
  if ((char)bVar1 < '\0') {
    sVar7 = (size_t)((uint)cd[-1].ctypeid + *(int *)&cd[-1].field_0xc);
    uVar2._0_1_ = cd[-1].marked;
    uVar2._1_1_ = cd[-1].gct;
    (g->gc).total = (g->gc).total - sVar7;
    cd = (GCcdata *)((long)cd - (ulong)uVar2);
  }
  else {
    lVar3 = *(long *)(g->ctype_state).ptr64;
    lVar5 = (ulong)cd->ctypeid * 0x18;
    if (*(uint *)(lVar3 + lVar5) < 0x60000000) {
      sVar7 = (ulong)*(uint *)(lVar3 + lVar5 + 4) + 0x10;
    }
    else {
      sVar7 = 0x18;
    }
    (g->gc).total = (g->gc).total - sVar7;
  }
  (*g->allocf)(g->allocd,cd,sVar7,0);
  return;
}

Assistant:

void LJ_FASTCALL lj_cdata_free(global_State *g, GCcdata *cd)
{
  if (LJ_UNLIKELY(cd->marked & LJ_GC_CDATA_FIN)) {
    GCobj *root;
    makewhite(g, obj2gco(cd));
    markfinalized(obj2gco(cd));
    if ((root = gcref(g->gc.mmudata)) != NULL) {
      setgcrefr(cd->nextgc, root->gch.nextgc);
      setgcref(root->gch.nextgc, obj2gco(cd));
      setgcref(g->gc.mmudata, obj2gco(cd));
    } else {
      setgcref(cd->nextgc, obj2gco(cd));
      setgcref(g->gc.mmudata, obj2gco(cd));
    }
  } else if (LJ_LIKELY(!cdataisv(cd))) {
    CType *ct = ctype_raw(ctype_ctsG(g), cd->ctypeid);
    CTSize sz = ctype_hassize(ct->info) ? ct->size : CTSIZE_PTR;
    lj_assertG(ctype_hassize(ct->info) || ctype_isfunc(ct->info) ||
	       ctype_isextern(ct->info), "free of ctype without a size");
    lj_mem_free(g, cd, sizeof(GCcdata) + sz);
  } else {
    lj_mem_free(g, memcdatav(cd), sizecdatav(cd));
  }
}